

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_heap.c
# Opt level: O1

void vmcache_heap_remove(heap *heap,extent *ext)

{
  ptr_ext_t *ppVar1;
  long lVar2;
  
  ppVar1 = ext->ptr;
  lVar2 = *(long *)(ppVar1 + -0x18);
  if (lVar2 != 0) {
    *(undefined8 *)(lVar2 + -0x10) = *(undefined8 *)(ppVar1 + -0x10);
  }
  if (*(long *)(ppVar1 + -0x10) != 0) {
    *(long *)(*(long *)(ppVar1 + -0x10) + -0x18) = lVar2;
  }
  if (heap->first_extent == ppVar1) {
    heap->first_extent = *(ptr_ext_t **)(ppVar1 + -0x18);
  }
  heap->entries = heap->entries - 1;
  return;
}

Assistant:

static void
vmcache_heap_remove(struct heap *heap, struct extent *ext)
{
	LOG(3, "heap %p ext %p", heap, ext);

	struct header *header = vmcache_extent_get_header(ext->ptr);

	ASSERT(header->next || header->prev ||
			(heap->first_extent == ext->ptr));

	if (header->next) {
		struct header *header_next =
				vmcache_extent_get_header(header->next);
		ASSERTeq(header_next->prev, ext->ptr);
		header_next->prev = header->prev;
	}

	if (header->prev) {
		struct header *header_prev =
				vmcache_extent_get_header(header->prev);
		ASSERTeq(header_prev->next, ext->ptr);
		header_prev->next = header->next;
	}

	if (heap->first_extent == ext->ptr)
		heap->first_extent = header->next;

#ifdef STATS_ENABLED
	heap->entries--;
#endif
}